

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * pad_or_truncate_password_V4(string *__return_storage_ptr__,string *password)

{
  allocator local_39;
  char local_38 [8];
  char k1 [32];
  string *password_local;
  
  k1._24_8_ = password;
  pad_or_truncate_password_V4(password,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,0x20,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

static std::string
pad_or_truncate_password_V4(std::string const& password)
{
    char k1[key_bytes];
    pad_or_truncate_password_V4(password, k1);
    return {k1, key_bytes};
}